

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemTreeView.h
# Opt level: O1

void __thiscall QFileSystemTreeView::~QFileSystemTreeView(QFileSystemTreeView *this)

{
  QTreeView::~QTreeView((QTreeView *)&this[-1].field_0x20);
  operator_delete(&this[-1].field_0x20,0x30);
  return;
}

Assistant:

class QT_WIDGETS_EXTRA_QT_WIDGETS_EXTRA_LIB_EXPORT QFileSystemTreeView : public QTreeView {
    Q_OBJECT
    class QFileSystemTreeViewPrivate *d;

    Q_PROPERTY(bool nameFilterDisables READ nameFilterDisables WRITE setNameFilterDisables)
    Q_PROPERTY(bool readOnly READ readOnly WRITE setReadOnly)
    Q_PROPERTY(bool resolveSymlinks READ resolveSymlinks WRITE setResolveSymlinks)
    Q_PROPERTY(QDir::Filters filters READ filters WRITE setFilters)
    Q_PROPERTY(QStringList nameFilters READ nameFilters WRITE setNameFilters)
    Q_PROPERTY(QFileSystemTreeView::Sections visibleSections READ visibleSections WRITE setVisibleSections)
    Q_PROPERTY(QString rootPath READ rootPath WRITE setRootPath NOTIFY rootPathChanged)

public:
    enum class Column {
        Name,
        Size,
        Type,
        LastModification
    };
    Q_ENUM(Column)

    enum class Section {
        All = 0,
        Name = 0x1,
        Size = 0x2,
        Type = 0x4,
        LastModification = 0x8
    };
    Q_ENUM(Section)
    Q_DECLARE_FLAGS(Sections, Section)
    Q_FLAG(Sections)

    explicit QFileSystemTreeView(QWidget *parent = nullptr);

    void setModel(QAbstractItemModel *model) override;

    bool nameFilterDisables() const;
    void setNameFilterDisables(bool nameFilterDisables);

    bool readOnly() const;
    void setReadOnly(bool readOnly);

    bool resolveSymlinks() const;
    void setResolveSymlinks(bool resolveSymlinks);

    QDir::Filters filters() const;
    void setFilters(QDir::Filters filters);

    QStringList nameFilters() const;
    void setNameFilters(const QStringList &nameFilters);

    QFileSystemTreeView::Sections visibleSections() const;
    void setVisibleSections(QFileSystemTreeView::Sections sections);

    QString rootPath() const;
    void setRootPath(const QString &rootPath);

    using QTreeView::setSelection;

    QStringList selection() const;
    void setSelection(const QStringList &selection);
    void addSelection(QStringList &selection);
    void clearSelection();

Q_SIGNALS:
    void directoryLoaded(const QString &path);
    void fileRenamed(const QString &path, const QString &oldName, const QString &newName);
    void rootPathChanged(const QString &newPath);
}